

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

boolean expire_gas_cloud(void *p1,void *p2)

{
  int iVar1;
  int damage;
  region *reg;
  void *p2_local;
  void *p1_local;
  
  iVar1 = *(int *)((long)p1 + 0x54);
  if (iVar1 >= 5) {
    *(int *)((long)p1 + 0x54) = iVar1 / 2;
    *(undefined2 *)((long)p1 + 0x30) = 2;
  }
  return iVar1 < 5;
}

Assistant:

boolean expire_gas_cloud(void *p1, void *p2)
{
    struct region *reg;
    int damage;

    reg = (struct region *) p1;
    damage = reg->arg;

    /* If it was a thick cloud, it dissipates a little first */
    if (damage >= 5) {
	damage /= 2;		/* It dissipates, let's do less damage */
	reg->arg = damage;
	reg->ttl = 2;		/* Here's the trick : reset ttl */
	return FALSE;		/* THEN return FALSE, means "still there" */
    }
    return TRUE;		/* OK, it's gone, you can free it! */
}